

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_normalize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  int iVar1;
  int iVar2;
  undefined1 local_40 [8];
  mbedtls_mpi T;
  
  X = &pt->Z;
  iVar2 = 0;
  iVar1 = mbedtls_mpi_cmp_int(X,0);
  if (iVar1 != 0) {
    mbedtls_mpi_init((mbedtls_mpi *)local_40);
    iVar2 = mbedtls_mpi_inv_mod((mbedtls_mpi *)local_40,X,&grp->P);
    if (iVar2 == 0) {
      X_00 = &pt->Y;
      iVar2 = mbedtls_mpi_mul_mod(grp,X_00,X_00,(mbedtls_mpi *)local_40);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_40,(mbedtls_mpi *)local_40,
                                    (mbedtls_mpi *)local_40);
        if (iVar2 == 0) {
          iVar2 = mbedtls_mpi_mul_mod(grp,&pt->X,&pt->X,(mbedtls_mpi *)local_40);
          if (iVar2 == 0) {
            iVar2 = mbedtls_mpi_mul_mod(grp,X_00,X_00,(mbedtls_mpi *)local_40);
            if (iVar2 == 0) {
              iVar2 = mbedtls_mpi_lset(X,1);
            }
          }
        }
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)local_40);
  }
  return iVar2;
}

Assistant:

static int ecp_normalize_jac(const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt)
{
    if (MPI_ECP_CMP_INT(&pt->Z, 0) == 0) {
        return 0;
    }

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_normalize_jac(grp, pt);
    }
#endif /* MBEDTLS_ECP_NORMALIZE_JAC_ALT */

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi T;
    mbedtls_mpi_init(&T);

    MPI_ECP_INV(&T,       &pt->Z);            /* T   <-          1 / Z   */
    MPI_ECP_MUL(&pt->Y,   &pt->Y,     &T);    /* Y'  <- Y*T    = Y / Z   */
    MPI_ECP_SQR(&T,       &T);                /* T   <- T^2    = 1 / Z^2 */
    MPI_ECP_MUL(&pt->X,   &pt->X,     &T);    /* X   <- X  * T = X / Z^2 */
    MPI_ECP_MUL(&pt->Y,   &pt->Y,     &T);    /* Y'' <- Y' * T = Y / Z^3 */

    MPI_ECP_LSET(&pt->Z, 1);

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT) */
}